

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_hIST(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  uint uVar1;
  int iVar2;
  byte local_22a;
  byte local_229;
  png_uint_16 local_228 [3];
  png_byte buf [2];
  png_uint_16 readbuf [256];
  uint i;
  uint num;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) != 0) {
    if (((png_ptr->mode & 4) == 0) && ((png_ptr->mode & 2) != 0)) {
      if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x40) == 0)) {
        uVar1 = length >> 1;
        if ((uVar1 == png_ptr->num_palette) && (uVar1 < 0x101)) {
          readbuf[0xfe] = 0;
          readbuf[0xff] = 0;
          for (; (uint)readbuf._508_4_ < uVar1; readbuf._508_4_ = readbuf._508_4_ + 1) {
            png_crc_read(png_ptr,&local_22a,2);
            local_228[(uint)readbuf._508_4_] = (ushort)local_22a * 0x100 + (ushort)local_229;
          }
          iVar2 = png_crc_finish(png_ptr,0);
          if (iVar2 == 0) {
            png_set_hIST(png_ptr,info_ptr,local_228);
          }
        }
        else {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"duplicate");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_hIST(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int num, i;
   png_uint_16 readbuf[PNG_MAX_PALETTE_LENGTH];

   png_debug(1, "in png_handle_hIST");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0 ||
       (png_ptr->mode & PNG_HAVE_PLTE) == 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_hIST) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   num = length / 2 ;

   if (num != (unsigned int) png_ptr->num_palette ||
       num > (unsigned int) PNG_MAX_PALETTE_LENGTH)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   for (i = 0; i < num; i++)
   {
      png_byte buf[2];

      png_crc_read(png_ptr, buf, 2);
      readbuf[i] = png_get_uint_16(buf);
   }

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   png_set_hIST(png_ptr, info_ptr, readbuf);
}